

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

void mpi_sub_hlp(size_t n,mbedtls_mpi_uint *s,mbedtls_mpi_uint *d)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong *puVar4;
  size_t sVar5;
  ulong uVar6;
  bool bVar7;
  
  if (n != 0) {
    lVar3 = 0;
    uVar2 = 0;
    sVar5 = 0;
    do {
      uVar1 = d[sVar5];
      uVar6 = uVar1 - uVar2;
      d[sVar5] = uVar6;
      uVar2 = (ulong)(uVar6 < s[sVar5]) + (ulong)(uVar1 < uVar2);
      d[sVar5] = uVar6 - s[sVar5];
      sVar5 = sVar5 + 1;
      lVar3 = lVar3 + -8;
    } while (n != sVar5);
    if (uVar2 != 0) {
      puVar4 = (ulong *)((long)d - lVar3);
      do {
        bVar7 = *puVar4 < uVar2;
        *puVar4 = *puVar4 - uVar2;
        puVar4 = puVar4 + 1;
        uVar2 = 1;
      } while (bVar7);
    }
  }
  return;
}

Assistant:

static void mpi_sub_hlp( size_t n, mbedtls_mpi_uint *s, mbedtls_mpi_uint *d )
{
    size_t i;
    mbedtls_mpi_uint c, z;

    for( i = c = 0; i < n; i++, s++, d++ )
    {
        z = ( *d <  c );     *d -=  c;
        c = ( *d < *s ) + z; *d -= *s;
    }

    while( c != 0 )
    {
        z = ( *d < c ); *d -= c;
        c = z; i++; d++;
    }
}